

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

void __thiscall spdlog::details::registry::update_levels(registry *this,log_levels *levels)

{
  _Hash_node_base *p_Var1;
  level_enum lVar2;
  __node_base *p_Var3;
  
  std::mutex::lock(&this->logger_map_mutex_);
  cfg::log_levels::operator=(&this->levels_,levels);
  p_Var3 = &(this->loggers_)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    p_Var1 = p_Var3[5]._M_nxt;
    lVar2 = cfg::log_levels::get(&this->levels_,(string *)(p_Var1 + 1));
    LOCK();
    *(level_enum *)&p_Var1[8]._M_nxt = lVar2;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void registry::update_levels(cfg::log_levels levels)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    levels_ = std::move(levels);
    for (auto &l : loggers_)
    {
        auto &logger = l.second;
        logger->set_level(levels_.get(logger->name()));
    }
}